

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O3

enable_if_t<is_olc_db<unodb::olc_db<std::uint64_t,_unodb::value_view>_>,_void> __thiscall
unodb::test::
tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::
do_insert<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
           *this,key_type k,value_view v)

{
  char *in_R9;
  string local_70;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  AssertHelper local_38;
  quiescent_state_on_scope_exit local_2c;
  
  local_2c.exceptions_at_ctor = std::uncaught_exceptions();
  local_50[0] = (internal)
                olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                insert_internal((olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                                 *)(this + 0x80),
                                (art_key_type)
                                (k >> 0x38 | (k & 0xff000000000000) >> 0x28 |
                                 (k & 0xff0000000000) >> 0x18 | (k & 0xff00000000) >> 8 |
                                 (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
                                 (k & 0xff00) << 0x28 | k << 0x38),v);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_50[0]) {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,local_50,(AssertionResult *)"test_db.insert(k, v)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x119,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  quiescent_state_on_scope_exit::~quiescent_state_on_scope_exit(&local_2c);
  return;
}

Assistant:

std::enable_if_t<is_olc_db<Db2>, void> do_insert(key_type k,
                                                   unodb::value_view v) {
    const quiescent_state_on_scope_exit qsbr_after_get{};
    UNODB_ASSERT_TRUE(test_db.insert(k, v));
  }